

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool __thiscall wallet::MockableBatch::ErasePrefix(MockableBatch *this,Span<const_std::byte> prefix)

{
  bool bVar1;
  long lVar2;
  MockableData *pMVar3;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  _Var4;
  iterator __position;
  _Self __tmp;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->m_pass;
  if (bVar1 == true) {
    pMVar3 = this->m_records;
    __position._M_node = (pMVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)__position._M_node != &(pMVar3->_M_t)._M_impl.super__Rb_tree_header) {
      if ((ulong)((long)__position._M_node[1]._M_parent - *(long *)(__position._M_node + 1)) <
          prefix.m_size) {
LAB_0069f4aa:
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
      else {
        _Var4 = std::
                __search<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::byte_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (*(long *)(__position._M_node + 1),__position._M_node[1]._M_parent,
                           prefix.m_data,prefix.m_data + prefix.m_size);
        if (_Var4._M_current != *(byte **)(__position._M_node + 1)) goto LAB_0069f4aa;
        __position = std::
                     _Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                     ::erase_abi_cxx11_((_Rb_tree<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::_Select1st<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
                                         *)this->m_records,__position);
      }
      pMVar3 = this->m_records;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool MockableBatch::ErasePrefix(Span<const std::byte> prefix)
{
    if (!m_pass) {
        return false;
    }
    auto it = m_records.begin();
    while (it != m_records.end()) {
        auto& key = it->first;
        if (key.size() < prefix.size() || std::search(key.begin(), key.end(), prefix.begin(), prefix.end()) != key.begin()) {
            it++;
            continue;
        }
        it = m_records.erase(it);
    }
    return true;
}